

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::~CodeGeneratorRequest(CodeGeneratorRequest *this)

{
  string *psVar1;
  pointer pcVar2;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__CodeGeneratorRequest_0046e278;
  psVar1 = (this->parameter_).ptr_;
  if (psVar1 != (string *)0x0 &&
      psVar1 != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &psVar1->field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(psVar1);
  }
  if ((this != (CodeGeneratorRequest *)_CodeGeneratorRequest_default_instance_) &&
     (this->compiler_version_ != (Version *)0x0)) {
    (*(this->compiler_version_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  internal::RepeatedPtrFieldBase::
  Destroy<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
            (&(this->proto_file_).super_RepeatedPtrFieldBase);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~RepeatedPtrField(&this->file_to_generate_);
  internal::
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  ::~InternalMetadataWithArenaBase
            (&(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
            );
  return;
}

Assistant:

CodeGeneratorRequest::~CodeGeneratorRequest() {
  // @@protoc_insertion_point(destructor:google.protobuf.compiler.CodeGeneratorRequest)
  SharedDtor();
}